

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtext.c
# Opt level: O2

int GetCodepoint(char *text,int *codepointSize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = *text;
  uVar6 = (uint)bVar1;
  *codepointSize = 1;
  if (-1 < (char)bVar1) {
    return (int)*text;
  }
  if ((uVar6 & 0xffffffe0) == 0xc0) {
    if (((byte)text[1] & 0xffffffc0) == 0x80) {
      if (0x1d < (byte)(bVar1 + 0x3e)) {
        return 0x3f;
      }
      uVar5 = (byte)text[1] & 0x3f | (uVar6 & 0x1f) << 6;
LAB_0016f787:
      *codepointSize = 2;
      return uVar5;
    }
  }
  else {
    if ((bVar1 & 0xf0) != 0xe0) {
      uVar5 = 0x3f;
      if (0xf4 < bVar1 || (bVar1 & 0xf8) != 0xf0) {
        return uVar5;
      }
      bVar2 = text[1];
      if ((bVar2 & 0xffffffc0) == 0x80) {
        bVar3 = text[2];
        if ((bVar3 & 0xffffffc0) != 0x80) goto LAB_0016f799;
        bVar4 = text[3];
        if ((bVar4 & 0xffffffc0) != 0x80) {
          *codepointSize = 4;
          return uVar5;
        }
        if (((bVar1 != 0xf0) || ((byte)(bVar2 + 0x70) < 0x30)) &&
           ((char)bVar2 < -0x70 || uVar6 != 0xf4)) {
          if (bVar1 < 0xf0) {
            return uVar5;
          }
          uVar6 = (bVar2 & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
          *codepointSize = 4;
          if (uVar6 < 0x110000) {
            uVar5 = bVar4 & 0x3f | (bVar3 & 0x3f) << 6 | uVar6;
          }
          return uVar5;
        }
      }
      goto LAB_0016f787;
    }
    bVar2 = text[1];
    if ((bVar2 & 0xffffffc0) == 0x80) {
      if (((byte)text[2] & 0xffffffc0) != 0x80) {
        *codepointSize = 3;
        return 0x3f;
      }
      if (((uVar6 != 0xe0) || ((bVar2 & 0xe0) == 0xa0)) && ((char)bVar2 < -0x60 || uVar6 != 0xed)) {
        if ((bVar1 & 0xf0) != 0xe0) {
          return 0x3f;
        }
        uVar5 = (byte)text[2] & 0x3f | (bVar2 & 0x3f) << 6 | (uVar6 & 0xf) << 0xc;
LAB_0016f799:
        *codepointSize = 3;
        return uVar5;
      }
    }
  }
  *codepointSize = 2;
  return 0x3f;
}

Assistant:

int GetCodepoint(const char *text, int *codepointSize)
{
/*
    UTF-8 specs from https://www.ietf.org/rfc/rfc3629.txt

    Char. number range  |        UTF-8 octet sequence
      (hexadecimal)    |              (binary)
    --------------------+---------------------------------------------
    0000 0000-0000 007F | 0xxxxxxx
    0000 0080-0000 07FF | 110xxxxx 10xxxxxx
    0000 0800-0000 FFFF | 1110xxxx 10xxxxxx 10xxxxxx
    0001 0000-0010 FFFF | 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
*/
    // NOTE: on decode errors we return as soon as possible

    int codepoint = 0x3f;   // Codepoint (defaults to '?')
    int octet = (unsigned char)(text[0]); // The first UTF8 octet
    *codepointSize = 1;

    if (octet <= 0x7f)
    {
        // Only one octet (ASCII range x00-7F)
        codepoint = text[0];
    }
    else if ((octet & 0xe0) == 0xc0)
    {
        // Two octets

        // [0]xC2-DF    [1]UTF8-tail(x80-BF)
        unsigned char octet1 = text[1];

        if ((octet1 == '\0') || ((octet1 >> 6) != 2)) { *codepointSize = 2; return codepoint; } // Unexpected sequence

        if ((octet >= 0xc2) && (octet <= 0xdf))
        {
            codepoint = ((octet & 0x1f) << 6) | (octet1 & 0x3f);
            *codepointSize = 2;
        }
    }
    else if ((octet & 0xf0) == 0xe0)
    {
        // Three octets
        unsigned char octet1 = text[1];
        unsigned char octet2 = '\0';

        if ((octet1 == '\0') || ((octet1 >> 6) != 2)) { *codepointSize = 2; return codepoint; } // Unexpected sequence

        octet2 = text[2];

        if ((octet2 == '\0') || ((octet2 >> 6) != 2)) { *codepointSize = 3; return codepoint; } // Unexpected sequence

        // [0]xE0    [1]xA0-BF       [2]UTF8-tail(x80-BF)
        // [0]xE1-EC [1]UTF8-tail    [2]UTF8-tail(x80-BF)
        // [0]xED    [1]x80-9F       [2]UTF8-tail(x80-BF)
        // [0]xEE-EF [1]UTF8-tail    [2]UTF8-tail(x80-BF)

        if (((octet == 0xe0) && !((octet1 >= 0xa0) && (octet1 <= 0xbf))) ||
            ((octet == 0xed) && !((octet1 >= 0x80) && (octet1 <= 0x9f)))) { *codepointSize = 2; return codepoint; }

        if ((octet >= 0xe0) && (octet <= 0xef))
        {
            codepoint = ((octet & 0xf) << 12) | ((octet1 & 0x3f) << 6) | (octet2 & 0x3f);
            *codepointSize = 3;
        }
    }
    else if ((octet & 0xf8) == 0xf0)
    {
        // Four octets
        if (octet > 0xf4) return codepoint;

        unsigned char octet1 = text[1];
        unsigned char octet2 = '\0';
        unsigned char octet3 = '\0';

        if ((octet1 == '\0') || ((octet1 >> 6) != 2)) { *codepointSize = 2; return codepoint; }  // Unexpected sequence

        octet2 = text[2];

        if ((octet2 == '\0') || ((octet2 >> 6) != 2)) { *codepointSize = 3; return codepoint; }  // Unexpected sequence

        octet3 = text[3];

        if ((octet3 == '\0') || ((octet3 >> 6) != 2)) { *codepointSize = 4; return codepoint; }  // Unexpected sequence

        // [0]xF0       [1]x90-BF       [2]UTF8-tail  [3]UTF8-tail
        // [0]xF1-F3    [1]UTF8-tail    [2]UTF8-tail  [3]UTF8-tail
        // [0]xF4       [1]x80-8F       [2]UTF8-tail  [3]UTF8-tail

        if (((octet == 0xf0) && !((octet1 >= 0x90) && (octet1 <= 0xbf))) ||
            ((octet == 0xf4) && !((octet1 >= 0x80) && (octet1 <= 0x8f)))) { *codepointSize = 2; return codepoint; } // Unexpected sequence

        if (octet >= 0xf0)
        {
            codepoint = ((octet & 0x7) << 18) | ((octet1 & 0x3f) << 12) | ((octet2 & 0x3f) << 6) | (octet3 & 0x3f);
            *codepointSize = 4;
        }
    }

    if (codepoint > 0x10ffff) codepoint = 0x3f;     // Codepoints after U+10ffff are invalid

    return codepoint;
}